

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O2

void CuSuiteSummary(CuSuite *testSuite,CuString *summary)

{
  char *text;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < testSuite->count; lVar1 = lVar1 + 1) {
    text = "F";
    if ((testSuite->list[lVar1]->failed == 0) &&
       (text = ".", testSuite->list[lVar1]->notImplemented != 0)) {
      text = "N";
    }
    CuStringAppend(summary,text);
  }
  CuStringAppend(summary,"\n\n");
  return;
}

Assistant:

void CuSuiteSummary(CuSuite* testSuite, CuString* summary)
{
	int i;
	char* str;

	for (i = 0 ; i < testSuite->count ; ++i)
	{
		CuTest* testCase = testSuite->list[i];

		if (testCase->failed)
			str = "F";
		else if (testCase->notImplemented)
			str = "N";
		else
			str = ".";

		CuStringAppend(summary, str);
	}
	CuStringAppend(summary, "\n\n");
}